

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O3

bool __thiscall pbrt::DisplayItem::SendOpenImage(DisplayItem *this,IPCChannel *ipcChannel)

{
  size_type sVar1;
  pointer pcVar2;
  pointer pbVar3;
  bool bVar4;
  uint uVar5;
  uchar *puVar6;
  size_type sVar7;
  ulong uVar8;
  pointer pbVar9;
  ulong uVar10;
  span<const_unsigned_char> message;
  uint8_t buffer [1024];
  uchar local_408 [1032];
  
  puVar6 = local_408 + 6;
  local_408[0] = '\0';
  local_408[1] = '\0';
  local_408[2] = '\0';
  local_408[3] = '\0';
  local_408[4] = '\x04';
  local_408[5] = '\x01';
  sVar1 = (this->title)._M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (this->title)._M_dataplus._M_p;
    sVar7 = 0;
    do {
      local_408[sVar7 + 6] = pcVar2[sVar7];
      sVar7 = sVar7 + 1;
    } while (sVar1 != sVar7);
    puVar6 = puVar6 + sVar7;
  }
  *puVar6 = '\0';
  pbVar9 = (this->channelNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar3 = (this->channelNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(int *)(puVar6 + 1) = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
  *(int *)(puVar6 + 5) = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  uVar5 = (uint)((ulong)((long)pbVar9 - (long)pbVar3) >> 5);
  *(uint *)(puVar6 + 9) = uVar5;
  puVar6 = puVar6 + 0xd;
  if (0 < (int)uVar5) {
    uVar8 = 0;
    do {
      pbVar9 = (this->channelNames).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pbVar9[uVar8]._M_string_length != 0) {
        pbVar9 = pbVar9 + uVar8;
        uVar10 = 0;
        do {
          puVar6[uVar10] = (pbVar9->_M_dataplus)._M_p[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar10 < pbVar9->_M_string_length);
        puVar6 = puVar6 + uVar10;
      }
      *puVar6 = '\0';
      puVar6 = puVar6 + 1;
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uVar5 & 0x7fffffff));
  }
  message.n = (long)puVar6 - (long)local_408;
  message.ptr = local_408;
  bVar4 = IPCChannel::Send(ipcChannel,message);
  return bVar4;
}

Assistant:

bool DisplayItem::SendOpenImage(IPCChannel &ipcChannel) {
    // Initial "open the image" message
    uint8_t buffer[1024];
    uint8_t *ptr = buffer;

    Serialize(&ptr, int(0));  // reserve space for message length
    Serialize(&ptr, DisplayDirective::CreateImage);
    uint8_t grabFocus = 1;
    Serialize(&ptr, grabFocus);
    Serialize(&ptr, title);

    int nChannels = channelNames.size();
    Serialize(&ptr, resolution.x);
    Serialize(&ptr, resolution.y);
    Serialize(&ptr, nChannels);
    for (int c = 0; c < nChannels; ++c)
        Serialize(&ptr, channelNames[c]);

    return ipcChannel.Send(pstd::MakeSpan(buffer, ptr - buffer));
}